

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbitblb.cpp
# Opt level: O3

void __thiscall
icu_63::RBBITableBuilder::sortedAdd(RBBITableBuilder *this,UVector **vector,int32_t val)

{
  int32_t iVar1;
  UVector *this_00;
  char cVar2;
  UErrorCode *status;
  int index;
  int iVar3;
  
  this_00 = *vector;
  if (this_00 == (UVector *)0x0) {
    this_00 = (UVector *)UMemory::operator_new((UMemory *)0x28,(size_t)vector);
    if (this_00 == (UVector *)0x0) {
      *vector = (UVector *)0x0;
      return;
    }
    UVector::UVector(this_00,this->fStatus);
    *vector = this_00;
  }
  status = this->fStatus;
  if (U_ZERO_ERROR < *status) {
    return;
  }
  iVar3 = this_00->count;
  index = 0;
  if (0 < iVar3) {
    do {
      iVar1 = UVector::elementAti(this_00,index);
      cVar2 = (val < iVar1) * '\x02';
      if (iVar1 == val) {
        cVar2 = '\x01';
      }
      if (cVar2 != '\0') {
        iVar3 = index;
        if (cVar2 != '\x02') {
          return;
        }
        break;
      }
      index = index + 1;
    } while (iVar3 != index);
    status = this->fStatus;
    index = iVar3;
  }
  UVector::insertElementAt(this_00,val,index,status);
  return;
}

Assistant:

void RBBITableBuilder::sortedAdd(UVector **vector, int32_t val) {
    int32_t i;

    if (*vector == NULL) {
        *vector = new UVector(*fStatus);
    }
    if (*vector == NULL || U_FAILURE(*fStatus)) {
        return;
    }
    UVector *vec = *vector;
    int32_t  vSize = vec->size();
    for (i=0; i<vSize; i++) {
        int32_t valAtI = vec->elementAti(i);
        if (valAtI == val) {
            // The value is already in the vector.  Don't add it again.
            return;
        }
        if (valAtI > val) {
            break;
        }
    }
    vec->insertElementAt(val, i, *fStatus);
}